

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Noise.cpp
# Opt level: O2

Vector * noise_3d(Vector *__return_storage_ptr__,Vector *p)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  double dVar32;
  double *pdVar33;
  uint uVar34;
  ulong uVar35;
  int b;
  int a;
  int iVar36;
  int a_00;
  int b_00;
  double dVar37;
  double dVar38;
  double dVar39;
  double dVar40;
  double dVar41;
  double dVar42;
  double dVar43;
  double dVar44;
  double dVar45;
  double dVar46;
  double dVar47;
  double dVar48;
  double dVar49;
  double dVar50;
  long jz;
  long jy;
  long jx;
  long iz;
  long iy;
  double tz;
  double ty;
  double sz;
  double sy;
  double local_238;
  undefined8 uStack_230;
  double local_228;
  undefined8 uStack_220;
  double local_218;
  double dStack_210;
  double local_208;
  double dStack_200;
  double local_1f8;
  double dStack_1f0;
  undefined4 local_1e8;
  undefined4 uStack_1e4;
  undefined4 uStack_1e0;
  undefined4 uStack_1dc;
  double local_1d8;
  double dStack_1d0;
  double local_1c8;
  double dStack_1c0;
  double local_1b8;
  double dStack_1b0;
  undefined4 local_1a8;
  undefined4 uStack_1a4;
  undefined4 uStack_1a0;
  undefined4 uStack_19c;
  double local_198;
  double dStack_190;
  double local_188;
  double dStack_180;
  double local_178;
  double dStack_170;
  undefined4 local_168;
  undefined4 uStack_164;
  undefined4 uStack_160;
  undefined4 uStack_15c;
  double local_158;
  double dStack_150;
  double local_148;
  double dStack_140;
  double local_138;
  double dStack_130;
  undefined4 local_128;
  undefined4 uStack_124;
  undefined4 uStack_120;
  undefined4 uStack_11c;
  double local_118;
  undefined8 uStack_110;
  double local_108;
  double dStack_100;
  double local_f8;
  double dStack_f0;
  double local_e8;
  double dStack_e0;
  undefined4 local_d8;
  undefined4 uStack_d4;
  undefined4 uStack_d0;
  undefined4 uStack_cc;
  undefined4 local_c8;
  undefined4 uStack_c4;
  undefined4 uStack_c0;
  undefined4 uStack_bc;
  undefined4 local_b8;
  undefined4 uStack_b4;
  undefined4 uStack_b0;
  undefined4 uStack_ac;
  undefined4 local_a8;
  undefined4 uStack_a4;
  undefined4 uStack_a0;
  undefined4 uStack_9c;
  double local_98;
  undefined8 uStack_90;
  undefined1 local_88 [16];
  double local_78;
  undefined8 uStack_70;
  long ix;
  double tx;
  double sx;
  Vector local_48;
  
  local_48.x = p->x;
  local_48.y = p->y;
  local_48.z = p->z;
  Noise3dCalls = Noise3dCalls + 1;
  setup_lattice(&local_48,&ix,&iy,&iz,&jx,&jy,&jz,&sx,&sy,&sz,&tx,&ty,&tz);
  dVar43 = local_48.z;
  dVar42 = local_48.y;
  dVar38 = local_48.x;
  a_00 = (int)ix;
  b_00 = (int)iy;
  iVar36 = (int)iz;
  uVar34 = HASH(a_00,b_00,iVar36);
  uVar35 = (ulong)(uVar34 & 0xff);
  dVar37 = dVar38 - (double)ix;
  dVar41 = dVar42 - (double)iy;
  dVar45 = dVar43 - (double)iz;
  local_228 = tx;
  uStack_220 = 0;
  dVar1 = noise_table[uVar35 + 1];
  dVar2 = noise_table[uVar35 + 5];
  dVar3 = noise_table[uVar35 + 9];
  dVar4 = noise_table[uVar35 + 8];
  dVar5 = noise_table[uVar35 + 10];
  dVar6 = noise_table[uVar35 + 0xb];
  local_78 = ty;
  uStack_70 = 0;
  dVar7 = noise_table[uVar35];
  dVar8 = noise_table[uVar35 + 2];
  dVar9 = noise_table[uVar35 + 3];
  dVar10 = noise_table[uVar35 + 4];
  dVar11 = noise_table[uVar35 + 6];
  dVar12 = noise_table[uVar35 + 7];
  a = (int)jx;
  uVar34 = HASH(a,b_00,iVar36);
  uVar35 = (ulong)(uVar34 & 0xff);
  dVar38 = dVar38 - (double)jx;
  local_238 = sx;
  uStack_230 = 0;
  local_88._8_4_ = SUB84(dVar2 * dVar37,0);
  local_88._0_8_ = noise_table[uVar35 + 1] * dVar38;
  local_88._12_4_ = (int)((ulong)(dVar2 * dVar37) >> 0x20);
  dVar2 = noise_table[uVar35 + 5];
  dVar13 = noise_table[uVar35 + 9];
  dVar14 = noise_table[uVar35 + 8];
  dVar15 = noise_table[uVar35 + 10];
  dVar16 = noise_table[uVar35 + 0xb];
  local_c8 = *(undefined4 *)(noise_table + uVar35);
  uStack_c4 = *(undefined4 *)((long)(noise_table + uVar35) + 4);
  uStack_c0 = SUB84(dVar10,0);
  uStack_bc = (undefined4)((ulong)dVar10 >> 0x20);
  local_b8 = *(undefined4 *)(noise_table + uVar35 + 2);
  uStack_b4 = *(undefined4 *)((long)(noise_table + uVar35 + 2) + 4);
  uStack_b0 = SUB84(dVar11,0);
  uStack_ac = (undefined4)((ulong)dVar11 >> 0x20);
  local_a8 = *(undefined4 *)(noise_table + uVar35 + 3);
  uStack_a4 = *(undefined4 *)((long)(noise_table + uVar35 + 3) + 4);
  uStack_a0 = SUB84(dVar12,0);
  uStack_9c = (undefined4)((ulong)dVar12 >> 0x20);
  dVar10 = noise_table[uVar35 + 4];
  dVar11 = noise_table[uVar35 + 6];
  dVar12 = noise_table[uVar35 + 7];
  b = (int)jy;
  uVar34 = HASH(a,b,iVar36);
  uVar35 = (ulong)(uVar34 & 0xff);
  dVar42 = dVar42 - (double)jy;
  dVar44 = local_238 * sy;
  local_98 = tz * dVar44;
  uStack_90 = 0;
  dVar39 = (noise_table[uVar35 + 0xb] * dVar45 +
           noise_table[uVar35 + 10] * dVar42 +
           noise_table[uVar35 + 8] * 0.5 + noise_table[uVar35 + 9] * dVar38) * local_98;
  local_f8 = noise_table[uVar35];
  local_108 = noise_table[uVar35 + 1];
  local_e8 = noise_table[uVar35 + 2];
  local_d8 = *(undefined4 *)(noise_table + uVar35 + 3);
  uStack_d4 = *(undefined4 *)((long)(noise_table + uVar35 + 3) + 4);
  dStack_100 = noise_table[uVar35 + 5];
  dStack_f0 = noise_table[uVar35 + 4];
  dStack_e0 = noise_table[uVar35 + 6];
  uStack_d0 = SUB84(noise_table[uVar35 + 7],0);
  uStack_cc = (undefined4)((ulong)noise_table[uVar35 + 7] >> 0x20);
  uVar34 = HASH(a_00,b,iVar36);
  uVar35 = (ulong)(uVar34 & 0xff);
  dVar46 = sy * local_228;
  local_118 = tz * dVar46;
  uStack_110 = 0;
  dVar40 = (noise_table[uVar35 + 0xb] * dVar45 +
           noise_table[uVar35 + 10] * dVar42 +
           noise_table[uVar35 + 8] * 0.5 + noise_table[uVar35 + 9] * dVar37) * local_118;
  local_148 = noise_table[uVar35];
  local_158 = noise_table[uVar35 + 1];
  local_138 = noise_table[uVar35 + 2];
  local_128 = *(undefined4 *)(noise_table + uVar35 + 3);
  uStack_124 = *(undefined4 *)((long)(noise_table + uVar35 + 3) + 4);
  dStack_150 = noise_table[uVar35 + 5];
  dStack_140 = noise_table[uVar35 + 4];
  dStack_130 = noise_table[uVar35 + 6];
  uStack_120 = SUB84(noise_table[uVar35 + 7],0);
  uStack_11c = (undefined4)((ulong)noise_table[uVar35 + 7] >> 0x20);
  iVar36 = (int)jz;
  uVar34 = HASH(a_00,b,iVar36);
  uVar35 = (ulong)(uVar34 & 0xff);
  dVar43 = dVar43 - (double)jz;
  dVar46 = dVar46 * sz;
  dVar17 = noise_table[uVar35 + 9];
  dVar18 = noise_table[uVar35 + 8];
  dVar19 = noise_table[uVar35 + 10];
  dVar20 = noise_table[uVar35 + 0xb];
  local_188 = noise_table[uVar35];
  local_198 = noise_table[uVar35 + 1];
  local_178 = noise_table[uVar35 + 2];
  local_168 = *(undefined4 *)(noise_table + uVar35 + 3);
  uStack_164 = *(undefined4 *)((long)(noise_table + uVar35 + 3) + 4);
  dStack_190 = noise_table[uVar35 + 5];
  dStack_180 = noise_table[uVar35 + 4];
  dStack_170 = noise_table[uVar35 + 6];
  uStack_160 = SUB84(noise_table[uVar35 + 7],0);
  uStack_15c = (undefined4)((ulong)noise_table[uVar35 + 7] >> 0x20);
  uVar34 = HASH(a,b,iVar36);
  uVar35 = (ulong)(uVar34 & 0xff);
  dVar44 = dVar44 * sz;
  dVar21 = noise_table[uVar35 + 9];
  dVar22 = noise_table[uVar35 + 8];
  dVar23 = noise_table[uVar35 + 10];
  dVar24 = noise_table[uVar35 + 0xb];
  local_1c8 = noise_table[uVar35];
  local_1d8 = noise_table[uVar35 + 1];
  local_1b8 = noise_table[uVar35 + 2];
  local_1a8 = *(undefined4 *)(noise_table + uVar35 + 3);
  uStack_1a4 = *(undefined4 *)((long)(noise_table + uVar35 + 3) + 4);
  dStack_1d0 = noise_table[uVar35 + 5];
  dStack_1c0 = noise_table[uVar35 + 4];
  dStack_1b0 = noise_table[uVar35 + 6];
  uStack_1a0 = SUB84(noise_table[uVar35 + 7],0);
  uStack_19c = (undefined4)((ulong)noise_table[uVar35 + 7] >> 0x20);
  uVar34 = HASH(a,b_00,iVar36);
  uVar35 = (ulong)(uVar34 & 0xff);
  dVar25 = noise_table[uVar35 + 9];
  dVar26 = noise_table[uVar35 + 8];
  dVar27 = noise_table[uVar35 + 10];
  dVar28 = noise_table[uVar35 + 0xb];
  local_218 = noise_table[uVar35];
  local_208 = noise_table[uVar35 + 1];
  local_1f8 = noise_table[uVar35 + 2];
  local_1e8 = *(undefined4 *)(noise_table + uVar35 + 3);
  uStack_1e4 = *(undefined4 *)((long)(noise_table + uVar35 + 3) + 4);
  dStack_200 = noise_table[uVar35 + 5];
  dStack_210 = noise_table[uVar35 + 4];
  dStack_1f0 = noise_table[uVar35 + 6];
  uStack_1e0 = SUB84(noise_table[uVar35 + 7],0);
  uStack_1dc = (undefined4)((ulong)noise_table[uVar35 + 7] >> 0x20);
  uVar34 = HASH(a_00,b_00,iVar36);
  pdVar33 = noise_table;
  dVar48 = tz * local_78 * local_238;
  dVar49 = tz * local_78 * local_228;
  dVar47 = local_78 * local_238 * sz;
  uVar35 = (ulong)(uVar34 & 0xff);
  dVar50 = local_78 * local_228 * sz;
  dVar29 = noise_table[uVar35 + 5];
  dVar30 = noise_table[uVar35 + 4];
  dVar31 = noise_table[uVar35 + 6];
  dVar32 = noise_table[uVar35 + 7];
  __return_storage_ptr__->x =
       dVar50 * (noise_table[uVar35 + 3] * dVar43 +
                noise_table[uVar35 + 2] * dVar41 +
                noise_table[uVar35] * 0.5 + noise_table[uVar35 + 1] * dVar37) +
       dVar47 * ((double)CONCAT44(uStack_1e4,local_1e8) * dVar43 +
                local_1f8 * dVar41 + local_218 * 0.5 + dVar38 * local_208) +
       dVar44 * ((double)CONCAT44(uStack_1a4,local_1a8) * dVar43 +
                dVar42 * local_1b8 + local_1c8 * 0.5 + local_1d8 * dVar38) +
       dVar46 * ((double)CONCAT44(uStack_164,local_168) * dVar43 +
                local_178 * dVar42 + local_188 * 0.5 + local_198 * dVar37) +
       local_118 *
       (dVar45 * (double)CONCAT44(uStack_124,local_128) +
       local_138 * dVar42 + local_148 * 0.5 + local_158 * dVar37) +
       local_98 *
       ((double)CONCAT44(uStack_d4,local_d8) * dVar45 +
       local_e8 * dVar42 + local_f8 * 0.5 + local_108 * dVar38) +
       dVar49 * (dVar9 * dVar45 + dVar8 * dVar41 + dVar7 * 0.5 + dVar1 * dVar37) +
       ((double)CONCAT44(uStack_a4,local_a8) * dVar45 +
       (double)CONCAT44(uStack_b4,local_b8) * dVar41 +
       (double)CONCAT44(uStack_c4,local_c8) * 0.5 + (double)local_88._0_8_) * dVar48;
  __return_storage_ptr__->y =
       dVar50 * (dVar32 * dVar43 + dVar31 * dVar41 + dVar30 * 0.5 + dVar29 * dVar37) +
       dVar47 * ((double)CONCAT44(uStack_1dc,uStack_1e0) * dVar43 +
                dStack_1f0 * dVar41 + dStack_210 * 0.5 + dVar38 * dStack_200) +
       dVar44 * ((double)CONCAT44(uStack_19c,uStack_1a0) * dVar43 +
                dVar42 * dStack_1b0 + dStack_1c0 * 0.5 + dStack_1d0 * dVar38) +
       dVar46 * ((double)CONCAT44(uStack_15c,uStack_160) * dVar43 +
                dStack_170 * dVar42 + dStack_180 * 0.5 + dStack_190 * dVar37) +
       local_118 *
       (dVar45 * (double)CONCAT44(uStack_11c,uStack_120) +
       dStack_130 * dVar42 + dStack_140 * 0.5 + dStack_150 * dVar37) +
       local_98 *
       ((double)CONCAT44(uStack_cc,uStack_d0) * dVar45 +
       dStack_e0 * dVar42 + dStack_f0 * 0.5 + dStack_100 * dVar38) +
       dVar48 * (dVar12 * dVar45 + dVar11 * dVar41 + dVar10 * 0.5 + dVar2 * dVar38) +
       ((double)CONCAT44(uStack_9c,uStack_a0) * dVar45 +
       (double)CONCAT44(uStack_ac,uStack_b0) * dVar41 +
       (double)CONCAT44(uStack_bc,uStack_c0) * 0.5 + (double)local_88._8_8_) * dVar49;
  __return_storage_ptr__->z =
       (dVar43 * pdVar33[uVar35 + 0xb] +
       dVar41 * pdVar33[uVar35 + 10] + pdVar33[uVar35 + 8] * 0.5 + dVar37 * pdVar33[uVar35 + 9]) *
       dVar50 + dVar47 * (dVar28 * dVar43 + dVar27 * dVar41 + dVar26 * 0.5 + dVar25 * dVar38) +
                dVar48 * (dVar16 * dVar45 + dVar15 * dVar41 + dVar14 * 0.5 + dVar13 * dVar38) +
                dVar49 * (dVar6 * dVar45 + dVar5 * dVar41 + dVar4 * 0.5 + dVar3 * dVar37) + dVar39 +
                dVar40 + (dVar20 * dVar43 + dVar19 * dVar42 + dVar18 * 0.5 + dVar17 * dVar37) *
                         dVar46 +
                (dVar24 * dVar43 + dVar23 * dVar42 + dVar22 * 0.5 + dVar21 * dVar38) * dVar44;
  return __return_storage_ptr__;
}

Assistant:

Vector noise_3d( const Vector& p )
{
   double sx,sy,sz,tx,ty,tz;
   long ix,iy,iz,jx,jy,jz;
   double s, px, py, pz;
   int   m;
   Vector result (0);
   Vector v = p;

   Noise3dCalls++;

   setup_lattice(v,ix,iy,iz,jx,jy,jz,sx,sy,sz,tx,ty,tz);

   double x = v.x;
   double y = v.y;
   double z = v.z;
   //
   // Interpolate
   //
   m =   HASH( ix, iy, iz ) & 0xFF;
   px = x-ix;  py = y-iy;  pz = z-iz;
   s =   tx*ty*tz;
   result.x = INCRSUM(m,s,px,py,pz);
   result.y = INCRSUM(m+4,s,px,py,pz);
   result.z = INCRSUM(m+8,s,px,py,pz);

   m =   HASH( jx, iy, iz ) & 0xFF;
   px = x-jx;
   s =   sx*ty*tz;
   result.x += INCRSUM(m,s,px,py,pz);
   result.y += INCRSUM(m+4,s,px,py,pz);
   result.z += INCRSUM(m+8,s,px,py,pz);

   m =   HASH( jx, jy, iz ) & 0xFF;
   py = y-jy;
   s =   sx*sy*tz;
   result.x += INCRSUM(m,s,px,py,pz);
   result.y += INCRSUM(m+4,s,px,py,pz);
   result.z += INCRSUM(m+8,s,px,py,pz);

   m =   HASH( ix, jy, iz ) & 0xFF;
   px = x-ix;
   s =   tx*sy*tz;
   result.x += INCRSUM(m,s,px,py,pz);
   result.y += INCRSUM(m+4,s,px,py,pz);
   result.z += INCRSUM(m+8,s,px,py,pz);

   m =   HASH( ix, jy, jz ) & 0xFF;
   pz = z-jz;
   s =   tx*sy*sz;
   result.x += INCRSUM(m,s,px,py,pz);
   result.y += INCRSUM(m+4,s,px,py,pz);
   result.z += INCRSUM(m+8,s,px,py,pz);

   m =   HASH( jx, jy, jz ) & 0xFF;
   px = x-jx;
   s =   sx*sy*sz;
   result.x += INCRSUM(m,s,px,py,pz);
   result.y += INCRSUM(m+4,s,px,py,pz);
   result.z += INCRSUM(m+8,s,px,py,pz);

   m =   HASH( jx, iy, jz ) & 0xFF;
   py = y-iy;
   s =   sx*ty*sz;
   result.x += INCRSUM(m,s,px,py,pz);
   result.y += INCRSUM(m+4,s,px,py,pz);
   result.z += INCRSUM(m+8,s,px,py,pz);

   m =   HASH( ix, iy, jz ) & 0xFF;
   px = x-ix;
   s =   tx*ty*sz;
   result.x += INCRSUM(m,s,px,py,pz);
   result.y += INCRSUM(m+4,s,px,py,pz);
   result.z += INCRSUM(m+8,s,px,py,pz);

// DEBUG
// printf("Noise3D: result == <%g %g %g>\n",result.x,result.y,result.z);
   return result;
}